

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::_::concat<kj::String,kj::StringPtr&,kj::CappedArray<char,32ul>>
          (String *__return_storage_ptr__,_ *this,String *params,StringPtr *params_1,
          CappedArray<char,_32UL> *params_2)

{
  void *__src;
  char *pcVar1;
  long lVar2;
  size_t sVar3;
  char *__dest;
  void *pvVar4;
  size_t local_40 [2];
  char *local_30;
  
  sVar3 = 0;
  local_40[0] = *(long *)(this + 8) - 1;
  if (*(long *)(this + 8) == 0) {
    local_40[0] = sVar3;
  }
  local_40[1] = (params->content).size_ - 1;
  local_30 = (params_1->content).ptr;
  lVar2 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)local_40 + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x18);
  heapString(__return_storage_ptr__,sVar3);
  __dest = (char *)(__return_storage_ptr__->content).size_;
  if (__dest != (char *)0x0) {
    __dest = (__return_storage_ptr__->content).ptr;
  }
  __src = *(void **)this;
  pvVar4 = (void *)((long)__src + *(long *)(this + 8) + -1);
  if (*(long *)(this + 8) == 0) {
    pvVar4 = (void *)0x0;
    __src = (void *)0x0;
  }
  if (__src != pvVar4) {
    memcpy(__dest,__src,(long)pvVar4 - (long)__src);
    __dest = __dest + ((long)pvVar4 - (long)__src);
  }
  pcVar1 = (params->content).ptr;
  sVar3 = (params->content).size_;
  if (pcVar1 != pcVar1 + (sVar3 - 1)) {
    memcpy(__dest,pcVar1,sVar3 - 1);
    __dest = __dest + (sVar3 - 1);
  }
  pcVar1 = (params_1->content).ptr;
  if (pcVar1 != (char *)0x0) {
    memcpy(__dest,&(params_1->content).size_,(size_t)pcVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}